

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O2

Sbl_Man_t * Sbl_ManAlloc(Gia_Man_t *pGia,int Number)

{
  int iVar1;
  Sbl_Man_t *pSVar2;
  sat_solver *s;
  Vec_Int_t *pVVar3;
  Hsh_VecMan_t *pHVar4;
  Vec_Wec_t *pVVar5;
  Vec_Wrd_t *pVVar6;
  uint uVar7;
  
  pSVar2 = (Sbl_Man_t *)calloc(1,0x198);
  pSVar2->nVars = Number;
  iVar1 = Number;
  if (1 < (uint)Number) {
    iVar1 = 0;
    for (uVar7 = Number - 1; uVar7 != 0; uVar7 = uVar7 >> 1) {
      iVar1 = iVar1 + 1;
    }
  }
  pSVar2->LogN = iVar1;
  pSVar2->Power2 = 1 << ((byte)iVar1 & 0x1f);
  s = Sbm_AddCardinSolver(iVar1,&pSVar2->vCardVars);
  pSVar2->pSat = s;
  iVar1 = sat_solver_nvars(s);
  pSVar2->FirstVar = iVar1;
  sat_solver_bookmark(pSVar2->pSat);
  pSVar2->pGia = pGia;
  pVVar3 = Vec_IntAlloc(pSVar2->nVars);
  pSVar2->vLeaves = pVVar3;
  pVVar3 = Vec_IntAlloc(pSVar2->nVars);
  pSVar2->vAnds = pVVar3;
  pVVar3 = Vec_IntAlloc(pSVar2->nVars);
  pSVar2->vNodes = pVVar3;
  pVVar3 = Vec_IntAlloc(pSVar2->nVars);
  pSVar2->vRoots = pVVar3;
  pVVar3 = Vec_IntAlloc(pSVar2->nVars);
  pSVar2->vRootVars = pVVar3;
  pHVar4 = (Hsh_VecMan_t *)calloc(1,0x48);
  iVar1 = Abc_PrimeCudd(1000);
  pVVar3 = Vec_IntAlloc(iVar1);
  pVVar3->nSize = iVar1;
  if (pVVar3->pArray != (int *)0x0) {
    memset(pVVar3->pArray,0xff,(long)iVar1 << 2);
  }
  pHVar4->vTable = pVVar3;
  pVVar3 = Vec_IntAlloc(4000);
  pHVar4->vData = pVVar3;
  pVVar3 = Vec_IntAlloc(1000);
  pHVar4->vMap = pVVar3;
  pSVar2->pHash = pHVar4;
  pVVar3 = Vec_IntAlloc(0);
  pSVar2->vArrs = pVVar3;
  pVVar3 = Vec_IntAlloc(0);
  pSVar2->vReqs = pVVar3;
  pVVar5 = (Vec_Wec_t *)malloc(0x10);
  pVVar5->nCap = 0x80;
  pVVar5->nSize = 0;
  pVVar3 = (Vec_Int_t *)calloc(0x80,0x10);
  pVVar5->pArray = pVVar3;
  pSVar2->vWindow = pVVar5;
  pVVar3 = Vec_IntAlloc(0x20);
  pSVar2->vPath = pVVar3;
  pVVar3 = Vec_IntAlloc(0x20);
  pSVar2->vEdges = pVVar3;
  pVVar6 = Vec_WrdAlloc(1000);
  pSVar2->vCutsI1 = pVVar6;
  pVVar6 = Vec_WrdAlloc(1000);
  pSVar2->vCutsI2 = pVVar6;
  pVVar6 = Vec_WrdAlloc(1000);
  pSVar2->vCutsN1 = pVVar6;
  pVVar6 = Vec_WrdAlloc(1000);
  pSVar2->vCutsN2 = pVVar6;
  pVVar3 = Vec_IntAlloc(0x40);
  pSVar2->vCutsNum = pVVar3;
  pVVar3 = Vec_IntAlloc(0x40);
  pSVar2->vCutsStart = pVVar3;
  pVVar3 = Vec_IntAlloc(1000);
  pSVar2->vCutsObj = pVVar3;
  pVVar3 = Vec_IntAlloc(0x40);
  pSVar2->vSolInit = pVVar3;
  pVVar3 = Vec_IntAlloc(0x40);
  pSVar2->vSolCur = pVVar3;
  pVVar3 = Vec_IntAlloc(0x40);
  pSVar2->vSolBest = pVVar3;
  pVVar6 = Vec_WrdAlloc(0x20);
  pSVar2->vTempI1 = pVVar6;
  pVVar6 = Vec_WrdAlloc(0x20);
  pSVar2->vTempI2 = pVVar6;
  pVVar6 = Vec_WrdAlloc(0x20);
  pSVar2->vTempN1 = pVVar6;
  pVVar6 = Vec_WrdAlloc(0x20);
  pSVar2->vTempN2 = pVVar6;
  pVVar3 = Vec_IntAlloc(0x40);
  pSVar2->vLits = pVVar3;
  pVVar3 = Vec_IntAlloc(0x40);
  pSVar2->vAssump = pVVar3;
  pVVar3 = Vec_IntAlloc(1000);
  pSVar2->vPolar = pVVar3;
  Gia_ManFillValue(pGia);
  return pSVar2;
}

Assistant:

Sbl_Man_t * Sbl_ManAlloc( Gia_Man_t * pGia, int Number )
{
    Sbl_Man_t * p = ABC_CALLOC( Sbl_Man_t, 1 );
    p->nVars      = Number;
    p->LogN       = Abc_Base2Log(Number);
    p->Power2     = 1 << p->LogN;
    p->pSat       = Sbm_AddCardinSolver( p->LogN, &p->vCardVars );
    p->FirstVar   = sat_solver_nvars( p->pSat );
    sat_solver_bookmark( p->pSat );
    // window
    p->pGia       = pGia;
    p->vLeaves    = Vec_IntAlloc( p->nVars );
    p->vAnds      = Vec_IntAlloc( p->nVars );
    p->vNodes     = Vec_IntAlloc( p->nVars );
    p->vRoots     = Vec_IntAlloc( p->nVars );
    p->vRootVars  = Vec_IntAlloc( p->nVars );
    p->pHash      = Hsh_VecManStart( 1000 );
    // timing
    p->vArrs      = Vec_IntAlloc( 0 );
    p->vReqs      = Vec_IntAlloc( 0 );
    p->vWindow    = Vec_WecAlloc( 128 );
    p->vPath      = Vec_IntAlloc( 32 );
    p->vEdges     = Vec_IntAlloc( 32 );
    // cuts
    p->vCutsI1    = Vec_WrdAlloc( 1000 );     // input bit patterns
    p->vCutsI2    = Vec_WrdAlloc( 1000 );     // input bit patterns
    p->vCutsN1    = Vec_WrdAlloc( 1000 );     // node bit patterns
    p->vCutsN2    = Vec_WrdAlloc( 1000 );     // node bit patterns
    p->vCutsNum   = Vec_IntAlloc( 64 );       // cut counts for each obj
    p->vCutsStart = Vec_IntAlloc( 64 );       // starting cuts for each obj
    p->vCutsObj   = Vec_IntAlloc( 1000 );
    p->vSolInit   = Vec_IntAlloc( 64 );
    p->vSolCur    = Vec_IntAlloc( 64 );
    p->vSolBest   = Vec_IntAlloc( 64 );
    p->vTempI1    = Vec_WrdAlloc( 32 ); 
    p->vTempI2    = Vec_WrdAlloc( 32 ); 
    p->vTempN1    = Vec_WrdAlloc( 32 ); 
    p->vTempN2    = Vec_WrdAlloc( 32 ); 
    // internal
    p->vLits      = Vec_IntAlloc( 64 );
    p->vAssump    = Vec_IntAlloc( 64 );
    p->vPolar     = Vec_IntAlloc( 1000 );
    // other
    Gia_ManFillValue( pGia );
    return p;
}